

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O2

Spectrum * __thiscall
phyr::MicrofacetReflection::f
          (Spectrum *__return_storage_ptr__,MicrofacetReflection *this,Vector3f *wo,Vector3f *wi)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined4 in_EAX;
  uint uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Spectrum F;
  undefined1 local_7c8 [16];
  double local_7b8;
  CoefficientSpectrum<60> local_7b0;
  CoefficientSpectrum<60> local_5d0;
  CoefficientSpectrum<60> local_3f0;
  CoefficientSpectrum<60> local_210;
  
  dVar1 = wo->z;
  dVar2 = wi->z;
  dVar4 = wo->x + wi->x;
  dVar5 = wo->y + wi->y;
  local_7b8 = dVar1 + dVar2;
  local_7c8._8_4_ = SUB84(dVar5,0);
  local_7c8._0_8_ = dVar4;
  local_7c8._12_4_ = (int)((ulong)dVar5 >> 0x20);
  if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((dVar2 == 0.0 && (!NAN(dVar2))))) {
LAB_0014176a:
    CoefficientSpectrum<60>::CoefficientSpectrum
              (&__return_storage_ptr__->super_CoefficientSpectrum<60>,0.0);
  }
  else {
    if ((local_7b8 == 0.0) && (!NAN(local_7b8))) {
      auVar3._8_4_ = (int)-(ulong)(dVar5 == 0.0);
      auVar3._0_8_ = -(ulong)(dVar4 == 0.0);
      auVar3._12_4_ = (int)(-(ulong)(dVar5 == 0.0) >> 0x20);
      uVar6 = movmskpd(in_EAX,auVar3);
      if (((uVar6 & 1) != 0) && ((byte)((byte)uVar6 >> 1) != 0)) goto LAB_0014176a;
    }
    normalize<double>((Vector3<double> *)&local_7b0,(Vector3<double> *)local_7c8);
    local_7b8 = local_7b0.samples[2];
    (**this->fresnel->_vptr_Fresnel)
              (SUB84(wi->z * local_7b0.samples[2] +
                     wi->x * local_7b0.samples[0] + wi->y * local_7b0.samples[1],0),&local_7b0);
    (*this->distribution->_vptr_MicrofacetDistribution[2])
              (this->distribution,(Vector3<double> *)local_7c8);
    CoefficientSpectrum<60>::operator*
              (&local_5d0,&(this->R).super_CoefficientSpectrum<60>,
               (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    (*this->distribution->_vptr_MicrofacetDistribution[4])(this->distribution,wo,wi);
    CoefficientSpectrum<60>::operator*
              (&local_3f0,&local_5d0,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    CoefficientSpectrum<60>::operator*(&local_210,&local_3f0,&local_7b0);
    CoefficientSpectrum<60>::operator/
              (&__return_storage_ptr__->super_CoefficientSpectrum<60>,&local_210,
               ABS(dVar2) * 4.0 * ABS(dVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

Spectrum MicrofacetReflection::f(const Vector3f& wo, const Vector3f& wi) const {
    Real cosThetaO = absCosTheta(wo), cosThetaI = absCosTheta(wi);
    Vector3f wh = wi + wo;

    // Handle degenerate cases for microfacet reflection
    if (cosThetaI == 0 || cosThetaO == 0) return Spectrum(0.);
    if (wh.x == 0 && wh.y == 0 && wh.z == 0) return Spectrum(0.);
    wh = normalize(wh);
    Spectrum F = fresnel->evaluate(dot(wi, wh));

    return R * distribution->d(wh) * distribution->g(wo, wi) * F / (4 * cosThetaI * cosThetaO);
}